

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_escaped_cp<fmt::v11::basic_appender<char>,char>
          (basic_appender<char> out,find_escape_result<char> *escape)

{
  int iVar1;
  basic_appender<char> out_00;
  basic_appender<char> out_01;
  basic_appender<char> out_02;
  basic_appender<char> bVar2;
  make_unsigned_t<long> count;
  iterator pcVar3;
  long *in_RSI;
  buffer<char> *in_RDI;
  char escape_char;
  iterator __end0;
  iterator __begin0;
  basic_string_view<char> *__range4;
  char c;
  char in_stack_ffffffffffffff4f;
  char cVar4;
  basic_appender<char> *in_stack_ffffffffffffff50;
  char *s;
  basic_appender<char> local_a0;
  buffer<char> *local_98;
  uint32_t cp;
  basic_appender<char> in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  iterator local_78;
  basic_string_view<char> local_70;
  basic_string_view<char> *local_60;
  basic_appender<char> local_40;
  basic_appender<char> local_38;
  basic_appender<char> local_30;
  basic_appender<char> local_28;
  char local_19;
  basic_appender<char> local_10 [2];
  
  local_19 = (char)in_RSI[2];
  iVar1 = (int)in_RSI[2];
  local_10[0].container = in_RDI;
  if (iVar1 == 9) {
    local_38 = basic_appender<char>::operator++(local_10,0);
    basic_appender<char>::operator*(&local_38);
    basic_appender<char>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
    local_19 = 't';
  }
  else if (iVar1 == 10) {
    local_28 = basic_appender<char>::operator++(local_10,0);
    basic_appender<char>::operator*(&local_28);
    basic_appender<char>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
    local_19 = 'n';
  }
  else if (iVar1 == 0xd) {
    local_30 = basic_appender<char>::operator++(local_10,0);
    basic_appender<char>::operator*(&local_30);
    basic_appender<char>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
    local_19 = 'r';
  }
  else {
    if (((iVar1 != 0x22) && (iVar1 != 0x27)) && (iVar1 != 0x5c)) {
      cVar4 = (char)((ulong)in_stack_ffffffffffffff70.container >> 0x38);
      cp = (uint32_t)in_stack_ffffffffffffff70.container;
      if (*(uint *)(in_RSI + 2) < 0x100) {
        out_00.container._7_1_ = in_stack_ffffffffffffff7f;
        out_00.container._0_7_ = in_stack_ffffffffffffff78;
        bVar2 = write_codepoint<2ul,char,fmt::v11::basic_appender<char>>(out_00,cVar4,cp);
        return (basic_appender<char>)bVar2.container;
      }
      if (*(uint *)(in_RSI + 2) < 0x10000) {
        out_01.container._7_1_ = in_stack_ffffffffffffff7f;
        out_01.container._0_7_ = in_stack_ffffffffffffff78;
        bVar2 = write_codepoint<4ul,char,fmt::v11::basic_appender<char>>(out_01,cVar4,cp);
        return (basic_appender<char>)bVar2.container;
      }
      if (*(uint *)(in_RSI + 2) < 0x110000) {
        out_02.container._7_1_ = in_stack_ffffffffffffff7f;
        out_02.container._0_7_ = in_stack_ffffffffffffff78;
        bVar2 = write_codepoint<8ul,char,fmt::v11::basic_appender<char>>(out_02,cVar4,cp);
        return (basic_appender<char>)bVar2.container;
      }
      s = (char *)*in_RSI;
      count = to_unsigned<long>((long)s);
      basic_string_view<char>::basic_string_view(&local_70,s,count);
      local_60 = &local_70;
      local_78 = basic_string_view<char>::begin(local_60);
      pcVar3 = basic_string_view<char>::end(local_60);
      for (; local_78 != pcVar3; local_78 = local_78 + 1) {
        local_98 = local_10[0].container;
        bVar2.container._7_1_ = *local_78;
        bVar2.container._0_7_ = in_stack_ffffffffffffff78;
        in_stack_ffffffffffffff70 =
             write_codepoint<2ul,char,fmt::v11::basic_appender<char>>
                       (bVar2,(char)((ulong)in_stack_ffffffffffffff70.container >> 0x38),
                        (uint32_t)in_stack_ffffffffffffff70.container);
        local_10[0] = in_stack_ffffffffffffff70;
      }
      return (basic_appender<char>)local_10[0].container;
    }
    local_40 = basic_appender<char>::operator++(local_10,0);
    basic_appender<char>::operator*(&local_40);
    basic_appender<char>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
  }
  cVar4 = local_19;
  local_a0 = basic_appender<char>::operator++(local_10,0);
  basic_appender<char>::operator*(&local_a0);
  basic_appender<char>::operator=(in_stack_ffffffffffffff50,cVar4);
  return (basic_appender<char>)local_10[0].container;
}

Assistant:

auto write_escaped_cp(OutputIt out, const find_escape_result<Char>& escape)
    -> OutputIt {
  auto c = static_cast<Char>(escape.cp);
  switch (escape.cp) {
  case '\n':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('n');
    break;
  case '\r':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('r');
    break;
  case '\t':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('t');
    break;
  case '"':  FMT_FALLTHROUGH;
  case '\'': FMT_FALLTHROUGH;
  case '\\': *out++ = static_cast<Char>('\\'); break;
  default:
    if (escape.cp < 0x100) return write_codepoint<2, Char>(out, 'x', escape.cp);
    if (escape.cp < 0x10000)
      return write_codepoint<4, Char>(out, 'u', escape.cp);
    if (escape.cp < 0x110000)
      return write_codepoint<8, Char>(out, 'U', escape.cp);
    for (Char escape_char : basic_string_view<Char>(
             escape.begin, to_unsigned(escape.end - escape.begin))) {
      out = write_codepoint<2, Char>(out, 'x',
                                     static_cast<uint32_t>(escape_char) & 0xFF);
    }
    return out;
  }
  *out++ = c;
  return out;
}